

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::setSortingEnabled(QTableView *this,bool enable)

{
  initializer_list<QMetaObject::Connection> __l;
  initializer_list<QMetaObject::Connection> __l_00;
  bool bVar1;
  QTableViewPrivate *pQVar2;
  byte in_SIL;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  Connection *connection;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *__range1;
  QTableViewPrivate *d;
  iterator __end1;
  iterator __begin1;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  *in_stack_fffffffffffffed8;
  QTableView *in_stack_fffffffffffffee0;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>
  *in_stack_fffffffffffffef8;
  Connection *pCVar3;
  QHeaderView *in_stack_ffffffffffffff00;
  Connection *this_00;
  size_type in_stack_ffffffffffffff08;
  offset_in_QTableView_to_subr *in_stack_ffffffffffffff20;
  Object *in_stack_ffffffffffffff30;
  ConnectionType CVar4;
  Object *in_stack_ffffffffffffff38;
  Object *in_stack_ffffffffffffff40;
  code *sender;
  offset_in_QHeaderView_to_subr in_stack_ffffffffffffff50;
  offset_in_QHeaderView_to_subr in_stack_ffffffffffffff60;
  offset_in_QHeaderView_to_subr in_stack_ffffffffffffff70;
  reference in_stack_ffffffffffffff80;
  __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_28;
  Connection local_20 [2];
  Connection local_10;
  Connection local_8;
  
  local_8.d_ptr = *(void **)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTableView *)0x8b64e2);
  horizontalHeader(in_stack_fffffffffffffee0);
  QHeaderView::setSortIndicatorShown
            (in_stack_ffffffffffffff00,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
  local_28._M_current = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._M_current =
       (Connection *)
       std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::begin
                 ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
                  in_stack_fffffffffffffee0);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::end
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
             in_stack_fffffffffffffee0);
  while( true ) {
    CVar4 = (ConnectionType)in_stack_ffffffffffffff80;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                        *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         __gnu_cxx::
         __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
         ::operator*(&local_28);
    QObject::disconnect(in_stack_ffffffffffffff80);
    __gnu_cxx::
    __normal_iterator<QMetaObject::Connection_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::operator++(&local_28);
  }
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::clear
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)0x8b65ea);
  if ((bool)(in_SIL & 1) == false) {
    sender = QHeaderView::sectionPressed;
    QObject::connect<void(QHeaderView::*)(int),void(QTableView::*)(int)>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff50,in_RDI,in_stack_ffffffffffffff20,
               (ConnectionType)in_stack_ffffffffffffff70);
    QObject::connect<void(QHeaderView::*)(int),QTableView::setSortingEnabled(bool)::__0>
              ((Object *)sender,in_stack_ffffffffffffff60,(ContextType *)0x0,
               (anon_class_8_1_54a39804_for_o *)QHeaderView::sectionEntered,CVar4);
    __l_00._M_len = in_stack_ffffffffffffff08;
    __l_00._M_array = (iterator)in_stack_ffffffffffffff00;
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::operator=
              (in_stack_fffffffffffffef8,__l_00);
    pCVar3 = local_20;
    this_00 = &local_10;
    do {
      this_00 = this_00 + -1;
      QMetaObject::Connection::~Connection(this_00);
    } while (this_00 != pCVar3);
  }
  else {
    QHeaderView::sortIndicatorSection((QHeaderView *)in_stack_fffffffffffffee0);
    CVar4 = (ConnectionType)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    QHeaderView::sortIndicatorOrder((QHeaderView *)in_stack_fffffffffffffee0);
    sortByColumn(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 (SortOrder)in_stack_fffffffffffffed8);
    QObjectPrivate::
    connect<void(QHeaderView::*)(int,Qt::SortOrder),void(QTableViewPrivate::*)(int,Qt::SortOrder)>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff70,in_stack_ffffffffffffff38,
               (Function)QHeaderView::sortIndicatorChanged,CVar4);
    __l._M_len = in_stack_ffffffffffffff08;
    __l._M_array = (iterator)in_stack_ffffffffffffff00;
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::operator=
              (in_stack_fffffffffffffef8,__l);
    pCVar3 = &local_8;
    do {
      pCVar3 = pCVar3 + -1;
      QMetaObject::Connection::~Connection(pCVar3);
    } while (pCVar3 != &local_10);
  }
  pQVar2->sortingEnabled = (bool)(in_SIL & 1);
  if (*(void **)(in_FS_OFFSET + 0x28) != local_8.d_ptr) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSortingEnabled(bool enable)
{
    Q_D(QTableView);
    horizontalHeader()->setSortIndicatorShown(enable);
    for (const QMetaObject::Connection &connection : d->dynHorHeaderConnections)
        disconnect(connection);
    d->dynHorHeaderConnections.clear();
    if (enable) {
        //sortByColumn has to be called before we connect or set the sortingEnabled flag
        // because otherwise it will not call sort on the model.
        sortByColumn(d->horizontalHeader->sortIndicatorSection(),
                     d->horizontalHeader->sortIndicatorOrder());
        d->dynHorHeaderConnections = {
            QObjectPrivate::connect(d->horizontalHeader, &QHeaderView::sortIndicatorChanged,
                                    d, &QTableViewPrivate::sortIndicatorChanged)
        };
    } else {
        d->dynHorHeaderConnections = {
            connect(d->horizontalHeader, &QHeaderView::sectionPressed,
                    this, &QTableView::selectColumn),
            connect(d->horizontalHeader, &QHeaderView::sectionEntered,
                    this, [d](int column) {d->selectColumn(column, false); })
        };
    }
    d->sortingEnabled = enable;
}